

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int rehash(stmm_table *table)

{
  stmm_table_entry **__ptr;
  stmm_table_entry *psVar1;
  stmm_hash_func_type p_Var2;
  int iVar3;
  stmm_table_entry **ppsVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  stmm_table_entry *psVar10;
  uint uVar11;
  
  uVar8._0_4_ = table->num_bins;
  uVar8._4_4_ = table->num_entries;
  __ptr = table->bins;
  uVar11 = (int)((double)(int)(undefined4)uVar8 * table->grow_factor) | 1;
  table->num_bins = uVar11;
  table->num_entries = 0;
  ppsVar4 = (stmm_table_entry **)malloc((long)(int)uVar11 << 3);
  table->bins = ppsVar4;
  if (ppsVar4 == (stmm_table_entry **)0x0) {
    table->bins = __ptr;
    table->num_bins = (undefined4)uVar8;
    table->num_entries = uVar8._4_4_;
    iVar7 = -10000;
  }
  else {
    uVar5 = 0;
    uVar6 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      table->bins[uVar5] = (stmm_table_entry *)0x0;
    }
    iVar7 = 0;
    uVar6 = 0;
    if (0 < (int)(undefined4)uVar8) {
      uVar6 = uVar8 & 0xffffffff;
    }
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      psVar10 = __ptr[uVar8];
      while (psVar10 != (stmm_table_entry *)0x0) {
        psVar1 = psVar10->next;
        p_Var2 = table->hash;
        if (p_Var2 == stmm_ptrhash) {
          iVar3 = (int)(((ulong)psVar10->key >> 2) % (ulong)(long)table->num_bins);
        }
        else if (p_Var2 == stmm_numhash) {
          iVar9 = (int)psVar10->key;
          iVar3 = -iVar9;
          if (0 < iVar9) {
            iVar3 = iVar9;
          }
          iVar3 = iVar3 % table->num_bins;
        }
        else {
          iVar3 = (*p_Var2)(psVar10->key,table->num_bins);
          iVar7 = table->num_entries;
        }
        ppsVar4 = table->bins;
        psVar10->next = ppsVar4[iVar3];
        ppsVar4[iVar3] = psVar10;
        iVar7 = iVar7 + 1;
        table->num_entries = iVar7;
        psVar10 = psVar1;
      }
    }
    free(__ptr);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int
rehash (stmm_table *table)
{
    stmm_table_entry *ptr, *next, **old_bins;
    int i, old_num_bins, hash_val, old_num_entries;

    /* save old values */
    old_bins = table->bins;
    old_num_bins = table->num_bins;
    old_num_entries = table->num_entries;

    /* rehash */
    table->num_bins = (int) (table->grow_factor * old_num_bins);
    if (table->num_bins % 2 == 0) {
    table->num_bins += 1;
    }
    table->num_entries = 0;
    table->bins = ABC_ALLOC(stmm_table_entry *, table->num_bins);
    if (table->bins == NULL) {
    table->bins = old_bins;
    table->num_bins = old_num_bins;
    table->num_entries = old_num_entries;
    return STMM_OUT_OF_MEM;
    }
    /* initialize */
    for (i = 0; i < table->num_bins; i++) {
    table->bins[i] = 0;
    }

    /* copy data over */
    for (i = 0; i < old_num_bins; i++) {
    ptr = old_bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        hash_val = do_hash (ptr->key, table);
        ptr->next = table->bins[hash_val];
        table->bins[hash_val] = ptr;
        table->num_entries++;
        ptr = next;
    }
    }
    ABC_FREE(old_bins);

    return 1;
}